

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<unsigned_short> __thiscall
kj::anon_unknown_55::tryParseInteger<unsigned_short>(anon_unknown_55 *this,StringPtr *s)

{
  unsigned_short uVar1;
  Maybe<unsigned_long_long> local_30;
  ulong local_20;
  unsigned_long_long max;
  StringPtr *s_local;
  
  max = (unsigned_long_long)s;
  s_local = (StringPtr *)this;
  uVar1 = MaxValue_::operator_cast_to_unsigned_short((MaxValue_ *)&kj::maxValue);
  local_20 = (ulong)uVar1;
  tryParseUnsigned((anon_unknown_55 *)&local_30,(StringPtr *)max,local_20);
  Maybe<unsigned_short>::Maybe<unsigned_long_long>((Maybe<unsigned_short> *)this,&local_30);
  Maybe<unsigned_long_long>::~Maybe(&local_30);
  return (Maybe<unsigned_short>)SUB84(this,0);
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}